

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_document_start(yaml_parser_t *parser,yaml_event_t *event,int implicit)

{
  yaml_parser_state_t *pyVar1;
  yaml_version_directive_t yVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  yaml_token_t *local_90;
  yaml_token_t *local_88;
  yaml_token_t *local_80;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  anon_struct_16_2_267fbce2 tag_directives;
  yaml_version_directive_t *version_directive;
  yaml_token_t *token;
  int implicit_local;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  tag_directives.end = (yaml_tag_directive_t *)0x0;
  memset(&start_mark.column,0,0x10);
  if ((parser->token_available == 0) && (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 == 0))
  {
    local_80 = (yaml_token_t *)0x0;
  }
  else {
    local_80 = (parser->tokens).head;
  }
  version_directive = (yaml_version_directive_t *)local_80;
  if (local_80 == (yaml_token_t *)0x0) {
    parser_local._4_4_ = 0;
  }
  else if (implicit == 0) {
    do {
      if (version_directive->major != 6) goto LAB_00231b16;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = (parser->tokens).head + 1;
      if ((parser->token_available == 0) &&
         (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 == 0)) {
        local_88 = (yaml_token_t *)0x0;
      }
      else {
        local_88 = (parser->tokens).head;
      }
      version_directive = (yaml_version_directive_t *)local_88;
    } while (local_88 != (yaml_token_t *)0x0);
    parser_local._4_4_ = 0;
  }
  else {
LAB_00231b16:
    if ((((implicit == 0) || (version_directive->major == 3)) || (version_directive->major == 4)) ||
       ((version_directive->major == 5 || (version_directive->major == 2)))) {
      if (version_directive->major == 2) {
        parser->state = YAML_PARSE_END_STATE;
        memset(event,0,0x68);
        event->type = YAML_STREAM_END_EVENT;
        (event->start_mark).index = (size_t)version_directive[4];
        (event->start_mark).line = (size_t)version_directive[5];
        (event->start_mark).column = (size_t)version_directive[6];
        (event->end_mark).index = (size_t)version_directive[7];
        (event->end_mark).line = (size_t)version_directive[8];
        (event->end_mark).column = (size_t)version_directive[9];
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN)
        ;
        (parser->tokens).head = (parser->tokens).head + 1;
        parser_local._4_4_ = 1;
      }
      else {
        yVar2 = version_directive[4];
        start_mark.index = *(size_t *)(version_directive + 5);
        start_mark.line = *(size_t *)(version_directive + 6);
        iVar6 = yaml_parser_process_directives
                          (parser,(yaml_version_directive_t **)&tag_directives.end,
                           (yaml_tag_directive_t **)&start_mark.column,&tag_directives.start);
        if (iVar6 == 0) {
          parser_local._4_4_ = 0;
        }
        else {
          if ((parser->token_available == 0) &&
             (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 == 0)) {
            local_90 = (yaml_token_t *)0x0;
          }
          else {
            local_90 = (parser->tokens).head;
          }
          if (local_90 != (yaml_token_t *)0x0) {
            if (local_90->type == YAML_DOCUMENT_START_TOKEN) {
              if (((parser->states).top != (parser->states).end) ||
                 (iVar6 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                            &(parser->states).end), iVar6 != 0)) {
                pyVar1 = (parser->states).top;
                (parser->states).top = pyVar1 + 1;
                *pyVar1 = YAML_PARSE_DOCUMENT_END_STATE;
                parser->state = YAML_PARSE_DOCUMENT_CONTENT_STATE;
                sVar3 = (local_90->end_mark).index;
                sVar4 = (local_90->end_mark).line;
                sVar5 = (local_90->end_mark).column;
                memset(event,0,0x68);
                event->type = YAML_DOCUMENT_START_EVENT;
                (event->start_mark).index = (size_t)yVar2;
                (event->start_mark).line = start_mark.index;
                (event->start_mark).column = start_mark.line;
                (event->end_mark).index = sVar3;
                (event->end_mark).line = sVar4;
                (event->end_mark).column = sVar5;
                (event->data).document_start.version_directive =
                     (yaml_version_directive_t *)tag_directives.end;
                (event->data).document_start.tag_directives.start =
                     (yaml_tag_directive_t *)start_mark.column;
                (event->data).document_start.tag_directives.end = tag_directives.start;
                (event->data).document_start.implicit = 0;
                parser->token_available = 0;
                parser->tokens_parsed = parser->tokens_parsed + 1;
                parser->stream_end_produced =
                     (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
                (parser->tokens).head = (parser->tokens).head + 1;
                return 1;
              }
              parser->error = YAML_MEMORY_ERROR;
            }
            else {
              yaml_parser_set_parser_error
                        (parser,"did not find expected <document start>",local_90->start_mark);
            }
          }
          yaml_free(tag_directives.end);
          for (; (yaml_tag_directive_t *)start_mark.column != tag_directives.start;
              tag_directives.start = tag_directives.start + -1) {
            yaml_free(tag_directives.start[-1].handle);
            yaml_free(tag_directives.start[-1].prefix);
          }
          yaml_free((void *)start_mark.column);
          parser_local._4_4_ = 0;
        }
      }
    }
    else {
      iVar6 = yaml_parser_process_directives
                        (parser,(yaml_version_directive_t **)0x0,(yaml_tag_directive_t **)0x0,
                         (yaml_tag_directive_t **)0x0);
      if (iVar6 == 0) {
        parser_local._4_4_ = 0;
      }
      else if (((parser->states).top == (parser->states).end) &&
              (iVar6 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                         &(parser->states).end), iVar6 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        parser_local._4_4_ = 0;
      }
      else {
        pyVar1 = (parser->states).top;
        (parser->states).top = pyVar1 + 1;
        *pyVar1 = YAML_PARSE_DOCUMENT_END_STATE;
        parser->state = YAML_PARSE_BLOCK_NODE_STATE;
        memset(event,0,0x68);
        event->type = YAML_DOCUMENT_START_EVENT;
        (event->start_mark).index = (size_t)version_directive[4];
        (event->start_mark).line = (size_t)version_directive[5];
        (event->start_mark).column = (size_t)version_directive[6];
        (event->end_mark).index = (size_t)version_directive[4];
        (event->end_mark).line = (size_t)version_directive[5];
        (event->end_mark).column = (size_t)version_directive[6];
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.implicit = 1;
        parser_local._4_4_ = 1;
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_parse_document_start(yaml_parser_t *parser, yaml_event_t *event,
        int implicit)
{
    yaml_token_t *token;
    yaml_version_directive_t *version_directive = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
    } tag_directives = { NULL, NULL };

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    /* Parse extra document end indicators. */

    if (!implicit)
    {
        while (token->type == YAML_DOCUMENT_END_TOKEN) {
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) return 0;
        }
    }

    /* Parse an implicit document. */

    if (implicit && token->type != YAML_VERSION_DIRECTIVE_TOKEN &&
            token->type != YAML_TAG_DIRECTIVE_TOKEN &&
            token->type != YAML_DOCUMENT_START_TOKEN &&
            token->type != YAML_STREAM_END_TOKEN)
    {
        if (!yaml_parser_process_directives(parser, NULL, NULL, NULL))
            return 0;
        if (!PUSH(parser, parser->states, YAML_PARSE_DOCUMENT_END_STATE))
            return 0;
        parser->state = YAML_PARSE_BLOCK_NODE_STATE;
        DOCUMENT_START_EVENT_INIT(*event, NULL, NULL, NULL, 1,
                token->start_mark, token->start_mark);
        return 1;
    }

    /* Parse an explicit document. */

    else if (token->type != YAML_STREAM_END_TOKEN)
    {
        yaml_mark_t start_mark, end_mark;
        start_mark = token->start_mark;
        if (!yaml_parser_process_directives(parser, &version_directive,
                    &tag_directives.start, &tag_directives.end))
            return 0;
        token = PEEK_TOKEN(parser);
        if (!token) goto error;
        if (token->type != YAML_DOCUMENT_START_TOKEN) {
            yaml_parser_set_parser_error(parser,
                    "did not find expected <document start>", token->start_mark);
            goto error;
        }
        if (!PUSH(parser, parser->states, YAML_PARSE_DOCUMENT_END_STATE))
            goto error;
        parser->state = YAML_PARSE_DOCUMENT_CONTENT_STATE;
        end_mark = token->end_mark;
        DOCUMENT_START_EVENT_INIT(*event, version_directive,
                tag_directives.start, tag_directives.end, 0,
                start_mark, end_mark);
        SKIP_TOKEN(parser);
        version_directive = NULL;
        tag_directives.start = tag_directives.end = NULL;
        return 1;
    }

    /* Parse the stream end. */

    else
    {
        parser->state = YAML_PARSE_END_STATE;
        STREAM_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

error:
    yaml_free(version_directive);
    while (tag_directives.start != tag_directives.end) {
        yaml_free(tag_directives.end[-1].handle);
        yaml_free(tag_directives.end[-1].prefix);
        tag_directives.end --;
    }
    yaml_free(tag_directives.start);
    return 0;
}